

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrEventDataLocalizationChangedML *value)

{
  bool bVar1;
  char cVar2;
  NextChainResult NVar3;
  ValidateXrHandleResult VVar4;
  XrResult XVar5;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var6;
  undefined4 in_stack_fffffffffffffcd8;
  uint32_t in_stack_fffffffffffffcdc;
  allocator local_319;
  string local_318;
  string *local_2f8;
  allocator local_2e9;
  string local_2e8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_288;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar5 = XR_SUCCESS;
  local_2f8 = command_name;
  if (value->type != XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrEventDataLocalizationChangedML",
               value->type,"VUID-XrEventDataLocalizationChangedML-type-type",
               XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML,
               "XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar3 = ValidateNextChain(instance_info,local_2f8,objects_info,value->next,&valid_ext_structs,
                              &encountered_structs,&duplicate_ext_structs);
    if (NVar3 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_318);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_318,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::string
                ((string *)&local_318,"VUID-XrEventDataLocalizationChangedML-next-unique",&local_319
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f8,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2e8,
                 "Multiple structures of the same type(s) in \"next\" chain for XrEventDataLocalizationChangedML struct"
                 ,&local_2e9);
      CoreValidLogMessage(instance_info,&local_318,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f8,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1f8);
      std::__cxx11::string::~string((string *)&local_318);
LAB_00151409:
      std::__cxx11::string::~string((string *)&error_message);
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar3 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrEventDataLocalizationChangedML-next-next",
                 (allocator *)&local_2e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,objects_info);
      std::__cxx11::string::string
                ((string *)&local_318,
                 "Invalid structure(s) in \"next\" chain for XrEventDataLocalizationChangedML struct \"next\""
                 ,&local_319);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      goto LAB_00151409;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar5 != XR_SUCCESS) {
    return XVar5;
  }
  VVar4 = VerifyXrSessionHandle(&value->session);
  if (VVar4 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>
              ((XrSession_T *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::operator<<((ostream *)&error_message,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::string
              ((string *)&local_318,"VUID-XrEventDataLocalizationChangedML-session-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_318,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_210);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    return XR_ERROR_HANDLE_INVALID;
  }
  std::__cxx11::string::string
            ((string *)&error_message,"XrEventDataLocalizationChangedML",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_318,"state",(allocator *)&valid_ext_structs);
  bVar1 = ValidateXrEnum(instance_info,local_2f8,&error_message,&local_318,objects_info,value->state
                        );
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&error_message);
  if (bVar1) {
    XVar5 = ValidateXrStruct(instance_info,local_2f8,objects_info,true,true,&value->map);
    if (XVar5 != XR_SUCCESS) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrEventDataLocalizationChangedML-map-parameter",
                 (allocator *)&local_2e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_240,objects_info);
      std::__cxx11::string::string
                ((string *)&local_318,
                 "Structure XrEventDataLocalizationChangedML member map is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_240,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      p_Var6 = &local_240;
LAB_00151572:
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(p_Var6);
      std::__cxx11::string::~string((string *)&error_message);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    std::__cxx11::string::string
              ((string *)&error_message,"XrEventDataLocalizationChangedML",(allocator *)&local_2e8);
    std::__cxx11::string::string((string *)&local_318,"confidence",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,local_2f8,&error_message,&local_318,objects_info,
                           value->confidence);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&error_message);
    if (bVar1) {
      cVar2 = (value->errorFlags < 0x40) + '\x01';
      if (value->errorFlags == 0) {
        cVar2 = '\0';
      }
      if (cVar2 == '\x02') {
        return XR_SUCCESS;
      }
      if (cVar2 == '\0') {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrEventDataLocalizationChangedML-errorFlags-requiredbitmask",
                   (allocator *)&local_2e8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_270,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_318,
                   "XrLocalizationMapErrorFlagsML \"errorFlags\" flag must be non-zero",
                   (allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_270,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        p_Var6 = &local_270;
        goto LAB_00151572;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrEventDataLocalizationChangedML invalid member XrLocalizationMapErrorFlagsML \"errorFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcdc);
      std::operator<<((ostream *)&error_message,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::operator<<((ostream *)&error_message," contains illegal bit");
      std::__cxx11::string::string
                ((string *)&local_318,"VUID-XrEventDataLocalizationChangedML-errorFlags-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_288,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_318,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_288,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      p_Var6 = &local_288;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapConfidenceML \"confidence\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcdc);
      std::operator<<((ostream *)&error_message,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::string
                ((string *)&local_318,"VUID-XrEventDataLocalizationChangedML-confidence-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_258,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_318,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_258,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      p_Var6 = &local_258;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapStateML \"state\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcdc);
    std::operator<<((ostream *)&error_message,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::string
              ((string *)&local_318,"VUID-XrEventDataLocalizationChangedML-state-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_228,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_318,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_228,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    p_Var6 = &local_228;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var6);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrEventDataLocalizationChangedML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrEventDataLocalizationChangedML",
                             value->type, "VUID-XrEventDataLocalizationChangedML-type-type", XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML, "XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrEventDataLocalizationChangedML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrEventDataLocalizationChangedML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrEventDataLocalizationChangedML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&value->session);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSession handle \"session\" ";
            oss << HandleToHexString(value->session);
            CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-session-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Make sure the enum type XrLocalizationMapStateML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrEventDataLocalizationChangedML", "state", objects_info, value->state)) {
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapStateML \"state\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->state));
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-state-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrLocalizationMapML is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->map);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-map-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrEventDataLocalizationChangedML member map is invalid");
        return xr_result;
    }
    // Make sure the enum type XrLocalizationMapConfidenceML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrEventDataLocalizationChangedML", "confidence", objects_info, value->confidence)) {
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapConfidenceML \"confidence\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->confidence));
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-confidence-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    ValidateXrFlagsResult localization_map_error_flags_ml_result = ValidateXrLocalizationMapErrorFlagsML(value->errorFlags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == localization_map_error_flags_ml_result) {
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-errorFlags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrLocalizationMapErrorFlagsML \"errorFlags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != localization_map_error_flags_ml_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataLocalizationChangedML invalid member XrLocalizationMapErrorFlagsML \"errorFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->errorFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-errorFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}